

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

void __thiscall
olc::PixelGameEngine::DrawPartialRotatedDecal
          (PixelGameEngine *this,vf2d *pos,Decal *decal,float fAngle,vf2d *center,vf2d *source_pos,
          vf2d *source_size,vf2d *scale,Pixel *tint)

{
  float fVar1;
  float fVar2;
  initializer_list<olc::v2d_generic<float>_> __l;
  initializer_list<float> __l_00;
  initializer_list<olc::Pixel> __l_01;
  float fVar3;
  int iVar4;
  reference pvVar5;
  reference pvVar6;
  double dVar7;
  float fVar8;
  v2d_generic<float> local_1e8;
  v2d_generic<float> local_1e0;
  v2d_generic<float> local_1d8;
  v2d_generic<float> local_1d0;
  iterator local_1c8;
  undefined8 local_1c0;
  v2d_generic<float> local_1b8;
  v2d_generic<float> local_1b0;
  vf2d uvbr;
  vf2d uvtl;
  v2d_generic<float> local_194;
  v2d_generic<float> local_18c;
  value_type local_184;
  v2d_generic<float> local_17c;
  value_type local_174;
  int local_16c;
  float local_168;
  int i;
  float s;
  float c;
  v2d_generic<float> local_158;
  value_type local_150;
  v2d_generic<float> local_148;
  v2d_generic<float> local_140;
  value_type local_138;
  v2d_generic<float> local_130;
  v2d_generic<float> local_128;
  value_type local_120;
  v2d_generic<float> local_118;
  v2d_generic<float> local_110;
  value_type local_108;
  float local_100 [4];
  iterator local_f0;
  undefined8 local_e8;
  anon_union_4_2_12391da5_for_Pixel_0 local_d0;
  anon_union_4_2_12391da5_for_Pixel_0 local_cc;
  anon_union_4_2_12391da5_for_Pixel_0 local_c8;
  anon_union_4_2_12391da5_for_Pixel_0 local_c4;
  anon_union_4_2_12391da5_for_Pixel_0 *local_c0;
  undefined8 local_b8;
  undefined1 local_b0 [8];
  DecalInstance di;
  vf2d *source_size_local;
  vf2d *source_pos_local;
  vf2d *center_local;
  float fAngle_local;
  Decal *decal_local;
  vf2d *pos_local;
  PixelGameEngine *this_local;
  
  di._104_8_ = source_size;
  DecalInstance::DecalInstance((DecalInstance *)local_b0);
  di.tint.super__Vector_base<olc::Pixel,_std::allocator<olc::Pixel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 4;
  local_d0.field_1 =
       *(anon_struct_4_4_d83cdc77_for_anon_union_4_2_12391da5_for_Pixel_0_1 *)&tint->field_0;
  local_cc.field_1 =
       *(anon_struct_4_4_d83cdc77_for_anon_union_4_2_12391da5_for_Pixel_0_1 *)&tint->field_0;
  local_c8.field_1 =
       *(anon_struct_4_4_d83cdc77_for_anon_union_4_2_12391da5_for_Pixel_0_1 *)&tint->field_0;
  local_c4.field_1 =
       *(anon_struct_4_4_d83cdc77_for_anon_union_4_2_12391da5_for_Pixel_0_1 *)&tint->field_0;
  local_c0 = &local_d0;
  local_b8 = 4;
  __l_01._M_len = 4;
  __l_01._M_array = (iterator)local_c0;
  local_b0 = (undefined1  [8])decal;
  std::vector<olc::Pixel,_std::allocator<olc::Pixel>_>::operator=
            ((vector<olc::Pixel,_std::allocator<olc::Pixel>_> *)
             &di.w.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,__l_01);
  local_100[0] = 1.0;
  local_100[1] = 1.0;
  local_100[2] = 1.0;
  local_100[3] = 1.0;
  local_f0 = local_100;
  local_e8 = 4;
  __l_00._M_len = 4;
  __l_00._M_array = local_f0;
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)
             &di.uv.
              super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,__l_00);
  std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::resize
            ((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *)&di,4);
  v2d_generic<float>::v2d_generic(&local_118,0.0,0.0);
  v2d_generic<float>::operator-(&local_110,&local_118);
  v2d_generic<float>::operator*(&local_108,&local_110);
  pvVar5 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
           operator[]((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *)
                      &di,0);
  *pvVar5 = local_108;
  v2d_generic<float>::v2d_generic(&local_130,0.0,*(float *)(di._104_8_ + 4));
  v2d_generic<float>::operator-(&local_128,&local_130);
  v2d_generic<float>::operator*(&local_120,&local_128);
  pvVar5 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
           operator[]((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *)
                      &di,1);
  *pvVar5 = local_120;
  v2d_generic<float>::v2d_generic(&local_148,*(float *)di._104_8_,*(float *)(di._104_8_ + 4));
  v2d_generic<float>::operator-(&local_140,&local_148);
  v2d_generic<float>::operator*(&local_138,&local_140);
  pvVar5 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
           operator[]((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *)
                      &di,2);
  *pvVar5 = local_138;
  v2d_generic<float>::v2d_generic((v2d_generic<float> *)&s,*(float *)di._104_8_,0.0);
  v2d_generic<float>::operator-(&local_158,(v2d_generic<float> *)&s);
  v2d_generic<float>::operator*(&local_150,&local_158);
  pvVar5 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
           operator[]((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *)
                      &di,3);
  *pvVar5 = local_150;
  dVar7 = cos((double)fAngle);
  i = (int)(float)dVar7;
  dVar7 = sin((double)fAngle);
  local_168 = (float)dVar7;
  for (local_16c = 0; local_16c < 4; local_16c = local_16c + 1) {
    pvVar5 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
             operator[]((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                         *)&di,(long)local_16c);
    iVar4 = i;
    fVar1 = pvVar5->x;
    pvVar5 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
             operator[]((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                         *)&di,(long)local_16c);
    fVar8 = pvVar5->y * local_168;
    pvVar5 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
             operator[]((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                         *)&di,(long)local_16c);
    fVar3 = local_168;
    fVar2 = pvVar5->x;
    pvVar5 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
             operator[]((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                         *)&di,(long)local_16c);
    v2d_generic<float>::v2d_generic
              (&local_17c,fVar1 * (float)iVar4 - fVar8,fVar2 * fVar3 + pvVar5->y * (float)i);
    v2d_generic<float>::operator+(&local_174,pos);
    pvVar5 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
             operator[]((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                         *)&di,(long)local_16c);
    *pvVar5 = local_174;
    pvVar5 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
             operator[]((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                         *)&di,(long)local_16c);
    v2d_generic<float>::operator*(&local_194,pvVar5);
    v2d_generic<float>::operator*(&local_18c,&local_194.x);
    v2d_generic<float>::v2d_generic(&uvtl,1.0,1.0);
    v2d_generic<float>::operator-(&local_184,&local_18c);
    pvVar5 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
             operator[]((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                         *)&di,(long)local_16c);
    *pvVar5 = local_184;
    pvVar5 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
             operator[]((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                         *)&di,(long)local_16c);
    pvVar5->y = pvVar5->y * -1.0;
  }
  v2d_generic<float>::operator*(&uvbr,source_pos);
  v2d_generic<float>::operator*(&local_1b8,(v2d_generic<float> *)di._104_8_);
  v2d_generic<float>::operator+(&local_1b0,&uvbr);
  v2d_generic<float>::v2d_generic(&local_1e8,uvbr.x,uvbr.y);
  v2d_generic<float>::v2d_generic(&local_1e0,uvbr.x,local_1b0.y);
  v2d_generic<float>::v2d_generic(&local_1d8,local_1b0.x,local_1b0.y);
  v2d_generic<float>::v2d_generic(&local_1d0,local_1b0.x,uvbr.y);
  local_1c8 = &local_1e8;
  local_1c0 = 4;
  __l._M_len = 4;
  __l._M_array = local_1c8;
  std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::operator=
            ((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *)
             &di.pos.
              super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,__l);
  di.tint.super__Vector_base<olc::Pixel,_std::allocator<olc::Pixel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = this->nDecalMode;
  pvVar6 = std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>::operator[]
                     (&this->vLayers,(ulong)this->nTargetLayer);
  std::vector<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>::push_back
            (&pvVar6->vecDecalInstance,(value_type *)local_b0);
  DecalInstance::~DecalInstance((DecalInstance *)local_b0);
  return;
}

Assistant:

void PixelGameEngine::DrawPartialRotatedDecal(const olc::vf2d &pos, olc::Decal *decal, const float fAngle, const olc::vf2d &center, const olc::vf2d &source_pos, const olc::vf2d &source_size, const olc::vf2d &scale, const olc::Pixel &tint)
	{
		DecalInstance di;
		di.decal = decal;
		di.points = 4;
		di.tint = {tint, tint, tint, tint};
		di.w = {1, 1, 1, 1};
		di.pos.resize(4);
		di.pos[0] = (olc::vf2d(0.0f, 0.0f) - center) * scale;
		di.pos[1] = (olc::vf2d(0.0f, source_size.y) - center) * scale;
		di.pos[2] = (olc::vf2d(source_size.x, source_size.y) - center) * scale;
		di.pos[3] = (olc::vf2d(source_size.x, 0.0f) - center) * scale;
		float c = cos(fAngle), s = sin(fAngle);
		for (int i = 0; i < 4; i++)
		{
			di.pos[i] = pos + olc::vf2d(di.pos[i].x * c - di.pos[i].y * s, di.pos[i].x * s + di.pos[i].y * c);
			di.pos[i] = di.pos[i] * vInvScreenSize * 2.0f - olc::vf2d(1.0f, 1.0f);
			di.pos[i].y *= -1.0f;
		}

		olc::vf2d uvtl = source_pos * decal->vUVScale;
		olc::vf2d uvbr = uvtl + (source_size * decal->vUVScale);
		di.uv = {{uvtl.x, uvtl.y}, {uvtl.x, uvbr.y}, {uvbr.x, uvbr.y}, {uvbr.x, uvtl.y}};
		di.mode = nDecalMode;
		vLayers[nTargetLayer].vecDecalInstance.push_back(di);
	}